

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

Script * cfd::GetLockingScriptFromUtxoData(Script *__return_storage_ptr__,UtxoData *utxo)

{
  Descriptor desc;
  Script local_1c0;
  Script local_188 [6];
  
  cfd::core::Script::Script(__return_storage_ptr__,&utxo->locking_script);
  cfd::core::Address::GetAddress_abi_cxx11_();
  std::__cxx11::string::~string((string *)local_188);
  if (local_188[0].script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    if ((utxo->descriptor)._M_string_length != 0) {
      cfd::core::Descriptor::Parse((string *)local_188,(vector *)&utxo->descriptor);
      cfd::core::Descriptor::GetLockingScript();
      cfd::core::Script::operator=(__return_storage_ptr__,&local_1c0);
      core::Script::~Script(&local_1c0);
      core::DescriptorNode::~DescriptorNode((DescriptorNode *)local_188);
    }
  }
  else {
    cfd::core::Address::GetLockingScript();
    cfd::core::Script::operator=(__return_storage_ptr__,local_188);
    core::Script::~Script(local_188);
  }
  return __return_storage_ptr__;
}

Assistant:

static Script GetLockingScriptFromUtxoData(const UtxoData& utxo) {
  Script locking_script = utxo.locking_script;
  if (!utxo.address.GetAddress().empty()) {
    locking_script = utxo.address.GetLockingScript();
  } else if (!utxo.descriptor.empty()) {
    auto desc = Descriptor::Parse(utxo.descriptor);
    locking_script = desc.GetLockingScript();
  }
  return locking_script;
}